

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int attach_set_source(ATTACH_HANDLE attach,AMQP_VALUE source_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  int iVar2;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    iVar2 = 0x1192;
  }
  else {
    iVar2 = 0x11a2;
    if (source_value != (AMQP_VALUE)0x0) {
      item_value = amqpvalue_clone(source_value);
      if (item_value != (AMQP_VALUE)0x0) {
        iVar1 = amqpvalue_set_composite_item(attach->composite_value,5,item_value);
        iVar2 = 0x11a8;
        if (iVar1 == 0) {
          iVar2 = 0;
        }
        amqpvalue_destroy(item_value);
      }
    }
  }
  return iVar2;
}

Assistant:

int attach_set_source(ATTACH_HANDLE attach, AMQP_VALUE source_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        AMQP_VALUE source_amqp_value;
        if (source_value == NULL)
        {
            source_amqp_value = NULL;
        }
        else
        {
            source_amqp_value = amqpvalue_clone(source_value);
        }
        if (source_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(attach_instance->composite_value, 5, source_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(source_amqp_value);
        }
    }

    return result;
}